

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

void __thiscall
UniQueue<FileTarget>::
emplace_back<std::experimental::filesystem::v1::__cxx11::path_const&,std::__cxx11::string_const&,PackFormat&,long_const&>
          (UniQueue<FileTarget> *this,path *s,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_1,PackFormat *s_2,
          long *s_3)

{
  set<FileTarget,_std::less<FileTarget>,_std::allocator<FileTarget>_> *this_00;
  iterator *piVar1;
  _Elt_pointer prVar2;
  pair<std::_Rb_tree_iterator<FileTarget>,_bool> pVar3;
  _Map_pointer local_b8;
  _Deque_iterator<std::reference_wrapper<const_FileTarget>,_std::reference_wrapper<const_FileTarget>_&,_std::reference_wrapper<const_FileTarget>_*>
  it;
  iterator local_78;
  path *local_58;
  long *local_50;
  PackFormat *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  reference_wrapper<const_FileTarget> local_38;
  KEY key;
  
  if (this->dirty == true) {
    emplace_back<std::experimental::filesystem::v1::__cxx11::path_const&,std::__cxx11::string_const&,PackFormat&,long_const&>
              ();
  }
  this_00 = &this->unique;
  local_58 = s;
  pVar3 = std::
          _Rb_tree<FileTarget,FileTarget,std::_Identity<FileTarget>,std::less<FileTarget>,std::allocator<FileTarget>>
          ::
          _M_emplace_unique<std::experimental::filesystem::v1::__cxx11::path_const&,std::__cxx11::string_const&,PackFormat&,long_const&>
                    ((_Rb_tree<FileTarget,FileTarget,std::_Identity<FileTarget>,std::less<FileTarget>,std::allocator<FileTarget>>
                      *)this_00,s,s_1,s_2,s_3);
  local_38._M_data = (FileTarget *)((_Base_ptr)pVar3.first._M_node + 1);
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    it._M_node = (_Map_pointer)
                 (this->
                 super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
                 ).
                 super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_78._M_cur._0_4_ =
         *(undefined4 *)
          &(this->
           super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
           ).
           super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_78._M_cur._4_4_ =
         *(undefined4 *)
          ((long)&(this->
                  super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
                  ).
                  super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur + 4);
    local_78._M_first._0_4_ =
         *(undefined4 *)
          &(this->
           super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
           ).
           super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_first;
    local_78._M_first._4_4_ =
         *(undefined4 *)
          ((long)&(this->
                  super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
                  ).
                  super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first + 4);
    local_78._M_last._0_4_ =
         *(undefined4 *)
          &(this->
           super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
           ).
           super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_last;
    local_78._M_last._4_4_ =
         *(undefined4 *)
          ((long)&(this->
                  super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
                  ).
                  super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + 4);
    local_78._M_node._0_4_ =
         *(undefined4 *)
          &(this->
           super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
           ).
           super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_node;
    local_78._M_node._4_4_ =
         *(undefined4 *)
          ((long)&(this->
                  super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
                  ).
                  super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node + 4);
    local_50 = s_3;
    local_48 = s_2;
    local_40 = s_1;
    std::
    __find_if<std::_Deque_iterator<std::reference_wrapper<FileTarget_const>,std::reference_wrapper<FileTarget_const>&,std::reference_wrapper<FileTarget_const>*>,__gnu_cxx::__ops::_Iter_pred<UniQueue<FileTarget>::emplace_back<std::experimental::filesystem::v1::__cxx11::path_const&,std::__cxx11::string_const&,PackFormat&,long_const&>(std::experimental::filesystem::v1::__cxx11::path_const&,std::__cxx11::string_const&,PackFormat&,long_const&)::_lambda(std::reference_wrapper<FileTarget_const>const&)_1_>>
              (&local_b8,&it._M_node,&local_78,&local_38);
    it._M_node = local_b8;
    std::
    deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
    ::_M_erase(&local_78,
               &this->
                super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
               ,(iterator *)&it._M_node);
    std::
    _Rb_tree<FileTarget,_FileTarget,_std::_Identity<FileTarget>,_std::less<FileTarget>,_std::allocator<FileTarget>_>
    ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar3.first._M_node);
    pVar3 = std::
            _Rb_tree<FileTarget,FileTarget,std::_Identity<FileTarget>,std::less<FileTarget>,std::allocator<FileTarget>>
            ::
            _M_emplace_unique<std::experimental::filesystem::v1::__cxx11::path_const&,std::__cxx11::string_const&,PackFormat&,long_const&>
                      ((_Rb_tree<FileTarget,FileTarget,std::_Identity<FileTarget>,std::less<FileTarget>,std::allocator<FileTarget>>
                        *)this_00,local_58,local_40,local_48,local_50);
    local_38._M_data = (FileTarget *)(pVar3.first._M_node._M_node + 1);
  }
  prVar2 = (this->
           super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
           ).
           super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (prVar2 == (this->
                super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
                ).
                super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<std::reference_wrapper<FileTarget_const>,std::allocator<std::reference_wrapper<FileTarget_const>>>
    ::_M_push_back_aux<std::reference_wrapper<FileTarget_const>const&>
              ((deque<std::reference_wrapper<FileTarget_const>,std::allocator<std::reference_wrapper<FileTarget_const>>>
                *)this,&local_38);
  }
  else {
    prVar2->_M_data = local_38._M_data;
    piVar1 = &(this->
              super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
              ).
              super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  return;
}

Assistant:

void emplace_back(S&&... s)
    {
        if (dirty)
            cleanup();
        auto r = unique.emplace(std::forward<S>(s)...);
        KEY key = std::cref(*r.first);
        if (!r.second) { // If already present we must remove the prevous one in
                         // the deck
            auto it = std::find_if(
                PARENT::begin(), PARENT::end(),
                [&](const KEY& k) -> bool { return key.get() == k.get(); });
            PARENT::erase(it);
            unique.erase(r.first);
            r = unique.emplace(std::forward<S>(s)...);
            key = std::cref(*r.first);
        }
        PARENT::push_back(key);
    }